

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian-branching.hxx
# Opt level: O0

double __thiscall
lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>::optimize
          (HungarianBranching<lineage::heuristics::PartitionGraph> *this)

{
  bool bVar1;
  size_t sVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  double dVar3;
  future<double> *handle;
  iterator __end3;
  iterator __begin3;
  vector<std::future<double>,_std::allocator<std::future<double>_>_> *__range3;
  double objective;
  size_t frame;
  vector<std::future<double>,_std::allocator<std::future<double>_>_> handles;
  vector<std::future<double>,_std::allocator<std::future<double>_>_> *in_stack_ffffffffffffff38;
  __normal_iterator<std::future<double>_*,_std::vector<std::future<double>,_std::allocator<std::future<double>_>_>_>
  *in_stack_ffffffffffffff40;
  future<double> *in_stack_ffffffffffffff48;
  pointer *in_stack_ffffffffffffff50;
  future<double> *this_00;
  __normal_iterator<std::future<double>_*,_std::vector<std::future<double>,_std::allocator<std::future<double>_>_>_>
  local_80;
  undefined1 *local_78;
  double local_70;
  undefined7 in_stack_ffffffffffffffa8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__args_1;
  code *__args;
  offset_in_HungarianBranching<lineage::heuristics::PartitionGraph>_to_subr *__fn;
  launch in_stack_ffffffffffffffcc;
  future<double> *local_28;
  bool *in_stack_ffffffffffffffe0;
  
  memset(&stack0xffffffffffffffe0,0,0x18);
  std::vector<std::future<double>,_std::allocator<std::future<double>_>_>::vector
            ((vector<std::future<double>,_std::allocator<std::future<double>_>_> *)0x1c508d);
  local_28 = (future<double> *)0x0;
  while( true ) {
    this_00 = local_28;
    sVar2 = ProblemGraph::numberOfFrames
                      (*(ProblemGraph **)
                        (in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                        _M_impl.super__Vector_impl_data._M_finish[0xf]);
    if ((future<double> *)(sVar2 - 1) <= this_00) break;
    __args = optimizeStep;
    __fn = (offset_in_HungarianBranching<lineage::heuristics::PartitionGraph>_to_subr *)0x0;
    in_stack_ffffffffffffff50 =
         &(in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage;
    __args_1 = in_RDI;
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  *)in_stack_ffffffffffffff50,(size_type)local_28);
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  *)in_stack_ffffffffffffff50,
                 (size_type)
                 ((long)&(local_28->super___basic_future<double>)._M_state.
                         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr + 1));
    in_stack_ffffffffffffff38 =
         (vector<std::future<double>,_std::allocator<std::future<double>_>_> *)
         &stack0xffffffffffffffaf;
    std::
    async<double(lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>::*)(std::vector<unsigned_long,std::allocator<unsigned_long>>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,bool),lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>*,std::vector<unsigned_long,std::allocator<unsigned_long>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>&,bool>
              (in_stack_ffffffffffffffcc,__fn,
               (HungarianBranching<lineage::heuristics::PartitionGraph> **)__args,__args_1,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT17(1,in_stack_ffffffffffffffa8),in_stack_ffffffffffffffe0);
    std::vector<std::future<double>,std::allocator<std::future<double>>>::
    emplace_back<std::future<double>>
              ((vector<std::future<double>,_std::allocator<std::future<double>_>_> *)
               in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    std::future<double>::~future((future<double> *)0x1c5182);
    local_28 = (future<double> *)
               ((long)&(local_28->super___basic_future<double>)._M_state.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr + 1);
  }
  local_70 = 0.0;
  local_78 = &stack0xffffffffffffffe0;
  local_80._M_current =
       (future<double> *)
       std::vector<std::future<double>,_std::allocator<std::future<double>_>_>::begin
                 (in_stack_ffffffffffffff38);
  std::vector<std::future<double>,_std::allocator<std::future<double>_>_>::end
            (in_stack_ffffffffffffff38);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff40,
                       (__normal_iterator<std::future<double>_*,_std::vector<std::future<double>,_std::allocator<std::future<double>_>_>_>
                        *)in_stack_ffffffffffffff38);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::future<double>_*,_std::vector<std::future<double>,_std::allocator<std::future<double>_>_>_>
    ::operator*(&local_80);
    dVar3 = std::future<double>::get(this_00);
    local_70 = dVar3 + local_70;
    __gnu_cxx::
    __normal_iterator<std::future<double>_*,_std::vector<std::future<double>,_std::allocator<std::future<double>_>_>_>
    ::operator++(&local_80);
  }
  std::vector<std::future<double>,_std::allocator<std::future<double>_>_>::~vector
            ((vector<std::future<double>,_std::allocator<std::future<double>_>_> *)
             in_stack_ffffffffffffff50);
  return local_70;
}

Assistant:

inline double
HungarianBranching<GRAPH>::optimize()
{
    auto handles = std::vector<std::future<double>>();
    for (size_t frame = 0;
         frame < this->graph_.data_.problemGraph.numberOfFrames() - 1;
         ++frame) {
        handles.emplace_back(std::async(
            std::launch::async, &HungarianBranching<GRAPH>::optimizeStep, this,
            partitions_[frame], partitions_[frame + 1], true));
    }

    double objective = .0;
    for (auto& handle : handles)
        objective += handle.get();

    return objective;
}